

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_change_leaf(lyd_node_leaf_list *leaf,char *val_str)

{
  long lVar1;
  uint16_t uVar2;
  lys_node *plVar3;
  char *__s1;
  char *__ptr;
  int iVar4;
  char *pcVar5;
  lys_type *plVar6;
  LY_ERR *pLVar7;
  lyd_node_leaf_list *plVar8;
  ulong uVar9;
  
  if (leaf == (lyd_node_leaf_list *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EINVAL;
  }
  else {
    if ((leaf->parent == (lyd_node *)0x0) ||
       (plVar3 = leaf->parent->schema, plVar3->nodetype != LYS_LIST)) {
LAB_00156329:
      __s1 = leaf->value_str;
      pcVar5 = "";
      if (val_str != (char *)0x0) {
        pcVar5 = val_str;
      }
      iVar4 = strcmp(__s1,pcVar5);
      if (iVar4 == 0) {
        return 0;
      }
      uVar2 = leaf->value_type;
      __ptr = (leaf->value).binary;
      pcVar5 = lydict_insert(leaf->schema->module->ctx,pcVar5,0);
      leaf->value_str = pcVar5;
      plVar6 = lyp_parse_value((lys_type *)&leaf->schema[1].ref,&leaf->value_str,(lyxml_elem *)0x0,
                               leaf,(lyd_attr *)0x0,1,0);
      if (plVar6 == (lys_type *)0x0) {
        lydict_remove(leaf->schema->module->ctx,leaf->value_str);
        leaf->value_str = __s1;
        (leaf->value).binary = __ptr;
        return 1;
      }
      if (uVar2 == 2) {
        free(__ptr);
      }
      lydict_remove(leaf->schema->module->ctx,__s1);
      plVar8 = leaf;
      if ((leaf->field_0x9 & 1) != 0) {
        for (; plVar8 != (lyd_node_leaf_list *)0x0; plVar8 = (lyd_node_leaf_list *)plVar8->parent) {
          plVar8->field_0x9 = plVar8->field_0x9 & 0xfe;
        }
      }
      iVar4 = ly_new_node_validity(leaf->schema);
      leaf->validity = (uint8_t)iVar4;
      check_leaf_list_backlinks((lyd_node *)leaf,2);
      if ((leaf->schema->flags & 0x100) == 0) {
        return 0;
      }
      do {
        leaf = (lyd_node_leaf_list *)leaf->parent;
        if (leaf == (lyd_node_leaf_list *)0x0) {
          return 0;
        }
      } while (leaf->schema->nodetype != LYS_LIST);
      leaf->validity = leaf->validity | 1;
      return 0;
    }
    uVar9 = 0;
    do {
      if (plVar3->padding[2] == uVar9) goto LAB_00156329;
      lVar1 = uVar9 * 8;
      uVar9 = uVar9 + 1;
    } while ((char *)**(long **)(*(long *)&plVar3[1].flags + lVar1) != leaf->schema->name);
    ly_vlog(LYE_SPEC,LY_VLOG_LYD,leaf,"List key value cannot be changed.");
  }
  return 1;
}

Assistant:

API int
lyd_change_leaf(struct lyd_node_leaf_list *leaf, const char *val_str)
{
    const char *backup;
    lyd_val backup_val;
    struct lyd_node *parent;
    struct lys_node_list *slist;
    LY_DATA_TYPE backup_type;
    uint32_t i;

    if (!leaf) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    /* key value cannot be changed */
    if (leaf->parent && (leaf->parent->schema->nodetype == LYS_LIST)) {
        slist = (struct lys_node_list *)leaf->parent->schema;
        for (i = 0; i < slist->keys_size; ++i) {
            if (ly_strequal(slist->keys[i]->name, leaf->schema->name, 1)) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYD, leaf, "List key value cannot be changed.");
                return EXIT_FAILURE;
            }
        }
    }

    if (!strcmp(leaf->value_str, val_str ? val_str : "")) {
        /* the value remains the same */
        return EXIT_SUCCESS;
    }

    backup = leaf->value_str;
    backup_type = leaf->value_type;
    memcpy(&backup_val, &leaf->value, sizeof backup);
    leaf->value_str = lydict_insert(leaf->schema->module->ctx, val_str ? val_str : "", 0);
    /* leaf->value is erased by lyp_parse_value() */

    /* parse the type correctly, makes the value canonical if needed */
    if (!lyp_parse_value(&((struct lys_node_leaf *)leaf->schema)->type, &leaf->value_str, NULL, leaf, NULL, 1, 0)) {
        lydict_remove(leaf->schema->module->ctx, leaf->value_str);
        leaf->value_str = backup;
        memcpy(&leaf->value, &backup_val, sizeof backup);
        return EXIT_FAILURE;
    }
    if (backup_type == LY_TYPE_BITS) {
        free(backup_val.bit);
    }

    /* value is correct, remove backup */
    lydict_remove(leaf->schema->module->ctx, backup);

    /* clear the default flag, the value is different */
    if (leaf->dflt) {
        for (parent = (struct lyd_node *)leaf; parent; parent = parent->parent) {
            parent->dflt = 0;
        }
    }

    /* make the node non-validate */
    leaf->validity = ly_new_node_validity(leaf->schema);

    /* check possible leafref backlinks */
    check_leaf_list_backlinks((struct lyd_node *)leaf, 2);

    if (leaf->schema->flags & LYS_UNIQUE) {
        /* locate the first parent list */
        for (parent = leaf->parent; parent && parent->schema->nodetype != LYS_LIST; parent = parent->parent);

        /* set flag for future validation */
        if (parent) {
            parent->validity |= LYD_VAL_UNIQUE;
        }
    }

    return EXIT_SUCCESS;
}